

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer *ppbVar1;
  bool bVar2;
  TargetType targetType_00;
  int iVar3;
  cmGlobalNinjaGenerator *pcVar4;
  cmGeneratorTarget *this_00;
  cmLocalNinjaGenerator *pcVar5;
  string *psVar6;
  cmGeneratedFileStream *pcVar7;
  ostream *poVar8;
  char *pcVar9;
  cmMakefile *pcVar10;
  mapped_type *pmVar11;
  cmNinjaLinkLineDeviceComputer *this_01;
  pointer pcVar12;
  mapped_type *flags;
  mapped_type *linkFlags;
  ulong uVar13;
  cmGeneratorTarget *pcVar14;
  size_t sVar15;
  cmOutputConverter *local_a98;
  bool local_982;
  allocator<char> local_981;
  undefined1 local_980 [6];
  bool usedResponseFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  string local_920;
  string local_900;
  int local_8e0;
  char local_8da [2];
  int commandLineLengthLimit;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d0;
  allocator<char> local_8c1;
  key_type local_8c0;
  mapped_type *local_8a0;
  string *link_path;
  char *local_890;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_888;
  allocator<char> local_879;
  key_type local_878;
  mapped_type *local_858;
  string *linkLibraries;
  key_type local_848;
  string local_828;
  string local_808;
  undefined1 local_7e8 [8];
  string objPath;
  key_type local_7c0;
  undefined1 local_7a0 [8];
  string impLibPath;
  key_type local_778;
  string local_758;
  undefined1 local_738 [8];
  string install_dir;
  key_type local_710;
  allocator<char> local_6e9;
  key_type local_6e8;
  allocator<char> local_6c1;
  key_type local_6c0;
  allocator<char> local_699;
  key_type local_698;
  allocator<char> local_671;
  key_type local_670;
  undefined1 local_650 [8];
  string t_1;
  key_type local_628;
  allocator<char> local_601;
  key_type local_600;
  undefined1 local_5e0 [8];
  string t;
  key_type local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  allocator<char> local_571;
  key_type local_570;
  string local_550;
  allocator<char> local_529;
  key_type local_528;
  allocator<char> local_501;
  key_type local_500;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  key_type local_490;
  allocator<char> local_469;
  key_type local_468;
  allocator<char> local_441;
  key_type local_440;
  cmStateSnapshot local_420;
  cmStateDirectory local_408;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> local_3e0;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  key_type local_3d0;
  string local_3b0;
  cmLocalNinjaGenerator *local_390;
  cmLocalNinjaGenerator *localGen;
  byte local_361;
  undefined1 local_360 [7];
  bool useWatcomQuote;
  string createRule;
  string linkPath;
  string frameworkPath;
  cmNinjaDeps local_2e8;
  pointer *local_2d0;
  cmNinjaVars *vars;
  undefined1 local_2a8 [8];
  cmNinjaBuild build;
  undefined1 local_178 [4];
  TargetType targetType;
  undefined1 local_158 [8];
  string targetOutputImplib;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string targetOutputReal;
  string cfgName;
  string local_b0;
  string *local_90;
  string *objExt;
  undefined1 local_80 [8];
  string cudaLinkLanguage;
  bool requiresDeviceLinking;
  cmGeneratorTarget *genTarget;
  allocator<char> local_39;
  string local_38;
  cmGlobalNinjaGenerator *local_18;
  cmGlobalNinjaGenerator *globalGen;
  cmNinjaNormalTargetGenerator *this_local;
  
  globalGen = (cmGlobalNinjaGenerator *)this;
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  local_18 = pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CUDA",&local_39);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)pcVar4,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    this_00 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    pcVar14 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar5 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    cudaLinkLanguage.field_2._M_local_buf[0xf] =
         requireDeviceLinking
                   (pcVar14,(cmLocalGenerator *)pcVar5,
                    &(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    if ((bool)cudaLinkLanguage.field_2._M_local_buf[0xf]) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_80,"CUDA",(allocator<char> *)((long)&objExt + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&objExt + 7));
      pcVar10 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMAKE_CUDA_OUTPUT_EXTENSION",
                 (allocator<char> *)(cfgName.field_2._M_local_buf + 0xf));
      psVar6 = cmMakefile::GetSafeDefinition(pcVar10,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(cfgName.field_2._M_local_buf + 0xf));
      local_90 = psVar6;
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string
                ((string *)(targetOutputReal.field_2._M_local_buf + 8),(string *)psVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetOutputImplib.field_2 + 8),&this_00->ObjectDirectory,
                     "cmake_device_link");
      std::operator+(&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetOutputImplib.field_2 + 8),local_90);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)local_f8,&this->super_cmNinjaTargetGenerator,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)(targetOutputImplib.field_2._M_local_buf + 8));
      cmGeneratorTarget::GetFullPath
                ((string *)local_178,this_00,(string *)((long)&targetOutputReal.field_2 + 8),
                 ImportLibraryArtifact,false);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)local_158,&this->super_cmNinjaTargetGenerator,(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::operator=((string *)&this->DeviceLinkObject,(string *)local_f8);
      pcVar7 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar7);
      targetType_00 = cmGeneratorTarget::GetType(this_00);
      pcVar7 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      poVar8 = std::operator<<((ostream *)pcVar7,"# Device Link build statements for ");
      pcVar9 = cmState::GetTargetTypeName(targetType_00);
      poVar8 = std::operator<<(poVar8,pcVar9);
      poVar8 = std::operator<<(poVar8," target ");
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                ((string *)((long)&build.RspFile.field_2 + 8),&this->super_cmNinjaTargetGenerator);
      poVar8 = std::operator<<(poVar8,(string *)(build.RspFile.field_2._M_local_buf + 8));
      std::operator<<(poVar8,"\n\n");
      std::__cxx11::string::~string((string *)(build.RspFile.field_2._M_local_buf + 8));
      LanguageLinkerDeviceRule_abi_cxx11_((string *)&vars,this);
      cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_2a8,(string *)&vars);
      std::__cxx11::string::~string((string *)&vars);
      std::__cxx11::string::operator=((string *)local_2a8,"Link the ");
      pcVar9 = GetVisibleTypeName(this);
      std::__cxx11::string::operator+=((string *)local_2a8,pcVar9);
      std::__cxx11::string::operator+=((string *)local_2a8," ");
      std::__cxx11::string::operator+=((string *)local_2a8,(string *)local_f8);
      local_2d0 = &build.OrderOnlyDeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&build.Rule.field_2 + 8),(value_type *)local_f8);
      cmNinjaTargetGenerator::GetObjects_abi_cxx11_(&local_2e8,&this->super_cmNinjaTargetGenerator);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&build.ImplicitOuts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2e8);
      cmNinjaTargetGenerator::ComputeLinkDeps
                ((cmNinjaDeps *)((long)&frameworkPath.field_2 + 8),
                 &this->super_cmNinjaTargetGenerator,&this->TargetLinkLanguage);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&frameworkPath.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&build.ExplicitDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(__x);
      std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(createRule.field_2._M_local_buf + 8));
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      cmGeneratorTarget::GetCreateRuleVariable
                ((string *)local_360,this_00,&this->TargetLinkLanguage,psVar6);
      pcVar10 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&localGen,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     "_USE_WATCOM_QUOTE");
      bVar2 = cmMakefile::IsOn(pcVar10,(string *)&localGen);
      std::__cxx11::string::~string((string *)&localGen);
      local_361 = bVar2;
      local_390 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmOutputConverter::ConvertToOutputFormat
                (&local_3b0,
                 &(local_390->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_f8,SHELL);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"TARGET_FILE",
                 (allocator<char> *)
                 ((long)&linkLineComputer._M_t.
                         super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                         .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)ppbVar1,&local_3d0);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&linkLineComputer._M_t.
                         super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                         .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
      std::__cxx11::string::~string((string *)&local_3b0);
      this_01 = (cmNinjaLinkLineDeviceComputer *)operator_new(0x48);
      pcVar5 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_a98 = (cmOutputConverter *)0x0;
      if (pcVar5 != (cmLocalNinjaGenerator *)0x0) {
        local_a98 = &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      pcVar5 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmLocalGenerator::GetStateSnapshot(&local_420,(cmLocalGenerator *)pcVar5);
      cmStateSnapshot::GetDirectory(&local_408,&local_420);
      cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
                (this_01,local_a98,&local_408,local_18);
      std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
      unique_ptr<std::default_delete<cmLinkLineComputer>,void>
                ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)
                 &local_3e0,(pointer)this_01);
      pcVar12 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
                operator->(&local_3e0);
      cmLinkLineComputer::SetUseWatcomQuote(pcVar12,(bool)(local_361 & 1));
      pcVar5 = local_390;
      pcVar12 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                          (&local_3e0);
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,"LINK_LIBRARIES",&local_441);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)ppbVar1,&local_440);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"FLAGS",&local_469);
      flags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar1,&local_468);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,"LINK_FLAGS",&local_491);
      linkFlags = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_490);
      cmLocalGenerator::GetTargetFlags
                ((cmLocalGenerator *)pcVar5,pcVar12,psVar6,pmVar11,flags,linkFlags,
                 (string *)((long)&linkPath.field_2 + 8),(string *)((long)&createRule.field_2 + 8),
                 this_00);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator(&local_491);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator(&local_469);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b8,"JOB_POOL_LINK",&local_4b9);
      cmNinjaTargetGenerator::addPoolNinjaVariable
                (&this->super_cmNinjaTargetGenerator,&local_4b8,this_00,(cmNinjaVars *)local_2d0);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator(&local_4b9);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_500,"LINK_FLAGS",&local_501);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)ppbVar1,&local_500);
      cmGlobalNinjaGenerator::EncodeLiteral(&local_4e0,pmVar11);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"LINK_FLAGS",&local_529);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)ppbVar1,&local_528);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator(&local_529);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator(&local_501);
      cmCommonTargetGenerator::GetManifests_abi_cxx11_(&local_550,(cmCommonTargetGenerator *)this);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_570,"MANIFESTS",&local_571);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)ppbVar1,&local_570);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator(&local_571);
      std::__cxx11::string::~string((string *)&local_550);
      std::operator+(&local_598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&linkPath.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&createRule.field_2 + 8));
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5b8,"LINK_PATH",(allocator<char> *)(t.field_2._M_local_buf + 0xf))
      ;
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)ppbVar1,&local_5b8);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)(t.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_598);
      ppbVar1 = local_2d0;
      if (targetType_00 == EXECUTABLE) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"FLAGS",&local_601);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_600);
        std::__cxx11::string::string((string *)local_5e0,(string *)pmVar11);
        std::__cxx11::string::~string((string *)&local_600);
        std::allocator<char>::~allocator(&local_601);
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_390,(string *)local_5e0,this_00,(string *)local_80,
                   (string *)((long)&targetOutputReal.field_2 + 8));
        ppbVar1 = local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_628,"FLAGS",(allocator<char> *)(t_1.field_2._M_local_buf + 0xf))
        ;
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_628);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)local_5e0);
        std::__cxx11::string::~string((string *)&local_628);
        std::allocator<char>::~allocator((allocator<char> *)(t_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)local_5e0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_670,"ARCH_FLAGS",&local_671);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_670);
        std::__cxx11::string::string((string *)local_650,(string *)pmVar11);
        std::__cxx11::string::~string((string *)&local_670);
        std::allocator<char>::~allocator(&local_671);
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_390,(string *)local_650,this_00,(string *)local_80,
                   (string *)((long)&targetOutputReal.field_2 + 8));
        ppbVar1 = local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_698,"ARCH_FLAGS",&local_699);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_698);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)local_650);
        std::__cxx11::string::~string((string *)&local_698);
        std::allocator<char>::~allocator(&local_699);
        std::__cxx11::string::clear();
        cmLocalGenerator::AddLanguageFlagsForLinking
                  ((cmLocalGenerator *)local_390,(string *)local_650,this_00,(string *)local_80,
                   (string *)((long)&targetOutputReal.field_2 + 8));
        ppbVar1 = local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"LANGUAGE_COMPILE_FLAGS",&local_6c1);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_6c0);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)local_650);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator(&local_6c1);
        std::__cxx11::string::~string((string *)local_650);
      }
      bVar2 = cmGeneratorTarget::HasSOName(this_00,(string *)((long)&targetOutputReal.field_2 + 8));
      if (bVar2) {
        pcVar10 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
        pcVar9 = cmMakefile::GetSONameFlag(pcVar10,&this->TargetLinkLanguage);
        ppbVar1 = local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6e8,"SONAME_FLAG",&local_6e9);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_6e8);
        std::__cxx11::string::operator=((string *)pmVar11,pcVar9);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::allocator<char>::~allocator(&local_6e9);
        ppbVar1 = local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_710,"SONAME",
                   (allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_710);
        std::__cxx11::string::operator=
                  ((string *)pmVar11,(string *)&(this->TargetNames).SharedObject);
        std::__cxx11::string::~string((string *)&local_710);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
        if (targetType_00 == SHARED_LIBRARY) {
          pcVar14 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
          cmGeneratorTarget::GetInstallNameDirForBuildTree
                    ((string *)local_738,pcVar14,(string *)((long)&targetOutputReal.field_2 + 8));
          uVar13 = std::__cxx11::string::empty();
          if ((uVar13 & 1) == 0) {
            cmOutputConverter::ConvertToOutputFormat
                      (&local_758,
                       &(local_390->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,(string *)local_738,SHELL);
            ppbVar1 = local_2d0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_778,"INSTALLNAME_DIR",
                       (allocator<char> *)(impLibPath.field_2._M_local_buf + 0xf));
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)ppbVar1,&local_778);
            std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_758);
            std::__cxx11::string::~string((string *)&local_778);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(impLibPath.field_2._M_local_buf + 0xf));
            std::__cxx11::string::~string((string *)&local_758);
          }
          std::__cxx11::string::~string((string *)local_738);
        }
      }
      uVar13 = std::__cxx11::string::empty();
      if ((uVar13 & 1) == 0) {
        cmOutputConverter::ConvertToOutputFormat
                  ((string *)local_7a0,
                   &(local_390->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_158,SHELL);
        ppbVar1 = local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7c0,"TARGET_IMPLIB",
                   (allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_7c0);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)local_7a0);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::allocator<char>::~allocator((allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
        cmNinjaTargetGenerator::EnsureParentDirectoryExists
                  (&this->super_cmNinjaTargetGenerator,(string *)local_7a0);
        std::__cxx11::string::~string((string *)local_7a0);
      }
      pcVar14 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)local_7e8,pcVar14);
      pcVar5 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&local_828,&this->super_cmNinjaTargetGenerator,(string *)local_7e8);
      cmOutputConverter::ConvertToOutputFormat
                (&local_808,
                 &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_828,SHELL);
      ppbVar1 = local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_848,"OBJECT_DIR",(allocator<char> *)((long)&linkLibraries + 7));
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)ppbVar1,&local_848);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_808);
      std::__cxx11::string::~string((string *)&local_848);
      std::allocator<char>::~allocator((allocator<char> *)((long)&linkLibraries + 7));
      std::__cxx11::string::~string((string *)&local_808);
      std::__cxx11::string::~string((string *)&local_828);
      cmNinjaTargetGenerator::EnsureDirectoryExists
                (&this->super_cmNinjaTargetGenerator,(string *)local_7e8);
      cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
                (&this->super_cmNinjaTargetGenerator,(cmNinjaVars *)local_2d0);
      bVar2 = cmGlobalNinjaGenerator::IsGCCOnWindows(local_18);
      ppbVar1 = local_2d0;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_878,"LINK_LIBRARIES",&local_879);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_878);
        std::__cxx11::string::~string((string *)&local_878);
        std::allocator<char>::~allocator(&local_879);
        local_858 = pmVar11;
        local_888._M_current = (char *)std::__cxx11::string::begin();
        local_890 = (char *)std::__cxx11::string::end();
        link_path._7_1_ = 0x5c;
        link_path._6_1_ = 0x2f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_888,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_890,(char *)((long)&link_path + 7),(char *)((long)&link_path + 6));
        ppbVar1 = local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c0,"LINK_PATH",&local_8c1);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_8c0);
        std::__cxx11::string::~string((string *)&local_8c0);
        std::allocator<char>::~allocator(&local_8c1);
        local_8a0 = pmVar11;
        local_8d0._M_current = (char *)std::__cxx11::string::begin();
        _commandLineLengthLimit = (char *)std::__cxx11::string::end();
        local_8da[1] = 0x5c;
        local_8da[0] = '/';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_8d0,_commandLineLengthLimit,local_8da + 1,local_8da);
      }
      sVar15 = cmSystemTools::CalculateCommandLineLengthLimit();
      pcVar4 = local_18;
      LanguageLinkerDeviceRule_abi_cxx11_(&local_900,this);
      iVar3 = cmGlobalNinjaGenerator::GetRuleCmdLength(pcVar4,&local_900);
      std::__cxx11::string::~string((string *)&local_900);
      local_8e0 = (int)sVar15 - iVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_980,"CMakeFiles/",&local_981);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      std::operator+(&local_960,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_980,
                     psVar6);
      std::operator+(&local_940,&local_960,".rsp");
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&local_920,&this->super_cmNinjaTargetGenerator,&local_940);
      std::__cxx11::string::operator=
                ((string *)&build.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)&local_920);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)local_980);
      std::allocator<char>::~allocator(&local_981);
      pcVar5 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar14 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      cmLocalNinjaGenerator::AppendTargetDepends
                (pcVar5,pcVar14,
                 (cmNinjaDeps *)
                 &build.ImplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,DependOnTargetArtifact);
      pcVar4 = local_18;
      local_982 = false;
      pcVar7 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar4,(ostream *)pcVar7,(cmNinjaBuild *)local_2a8,local_8e0,&local_982);
      WriteDeviceLinkRule(this,(bool)(local_982 & 1));
      std::__cxx11::string::~string((string *)local_7e8);
      std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
                (&local_3e0);
      std::__cxx11::string::~string((string *)local_360);
      std::__cxx11::string::~string((string *)(createRule.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_2a8);
      std::__cxx11::string::~string((string *)local_158);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)(targetOutputReal.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement()
{
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();
  if (!globalGen->GetLanguageEnabled("CUDA")) {
    return;
  }

  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->GetLocalGenerator(), this->ConfigName);
  if (!requiresDeviceLinking) {
    return;
  }

  // Now we can do device linking

  // First and very important step is to make sure while inside this
  // step our link language is set to CUDA
  std::string cudaLinkLanguage = "CUDA";
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  std::string const cfgName = this->GetConfigName();
  std::string const targetOutputReal = ConvertToNinjaPath(
    genTarget->ObjectDirectory + "cmake_device_link" + objExt);

  std::string const targetOutputImplib = ConvertToNinjaPath(
    genTarget->GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  this->DeviceLinkObject = targetOutputReal;

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = genTarget->GetType();
  this->GetBuildFileStream() << "# Device Link build statements for "
                             << cmState::GetTargetTypeName(targetType)
                             << " target " << this->GetTargetName() << "\n\n";

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule());
  build.Comment = "Link the ";
  build.Comment += this->GetVisibleTypeName();
  build.Comment += " ";
  build.Comment += targetOutputReal;

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(targetOutputReal);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects();
  build.ImplicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule = genTarget->GetCreateRuleVariable(
    this->TargetLinkLanguage, this->GetConfigName());
  const bool useWatcomQuote =
    this->GetMakefile()->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    new cmNinjaLinkLineDeviceComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(),
      globalGen));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(
    linkLineComputer.get(), this->GetConfigName(), vars["LINK_LIBRARIES"],
    vars["FLAGS"], vars["LINK_FLAGS"], frameworkPath, linkPath, genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    localGen.AddLanguageFlagsForLinking(t, genTarget, cudaLinkLanguage,
                                        cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (genTarget->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars);

  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(this->LanguageLinkerDeviceRule());

  build.RspFile = this->ConvertToNinjaPath(std::string("CMakeFiles/") +
                                           genTarget->GetName() + ".rsp");

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 build.OrderOnlyDeps);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetBuildFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteDeviceLinkRule(usedResponseFile);
}